

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O3

char * read_cfg_line(cfg_file *cfg)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  char *p;
  char *__s;
  
  pcVar5 = cfg->cache;
  do {
    if (cfg->cache_on != 0) break;
    iVar2 = fgetc((FILE *)cfg->file);
    if (iVar2 == -1) {
      return (char *)0x0;
    }
    uVar6 = 0;
    do {
      iVar3 = feof((FILE *)cfg->file);
      if ((iVar2 == 10) || (iVar3 != 0)) break;
      cfg->cache[uVar6] = (char)iVar2;
      uVar6 = uVar6 + 1;
      iVar2 = fgetc((FILE *)cfg->file);
    } while (iVar2 != -1);
    pcVar5[uVar6 & 0xffffffff] = '\0';
  } while (*pcVar5 == '#');
  cfg->cache_on = 1;
  do {
    __s = pcVar5;
    pcVar5 = __s + 1;
  } while (*__s == ' ');
  sVar4 = strlen(__s);
  pcVar5 = __s + 1 + sVar4;
  do {
    pcVar1 = pcVar5 + -2;
    pcVar5 = pcVar5 + -1;
  } while (*pcVar1 == ' ');
  *pcVar5 = '\0';
  return __s;
}

Assistant:

static char *read_cfg_line(struct cfg_file *cfg)
{
    int ch;
    int i;

    while (!cfg->cache_on) {
        i = 0;

        while (1) {
            ch = fgetc(cfg->file);
            if (i == 0 && ch == EOF)
                return NULL;
            else if (ch == EOF || feof(cfg->file) || ch == '\n')
                break;

            cfg->cache[i++] = ch;
        }
        cfg->cache[i] = '\0';

        /* a note, ignore and get the next line */
        if (cfg->cache[0] != '#')
            break;
    }

    cfg->cache_on = 1;
    return string_trim(cfg->cache);
}